

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O0

int quicly_sendstate_activate(quicly_sendstate_t *state)

{
  long in_RDI;
  uint64_t end_off;
  undefined8 local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  local_18 = *(long *)(in_RDI + 0x58);
  if (local_18 != -1) {
    local_18 = local_18 + 1;
  }
  if ((*(long *)(in_RDI + 0x30) == 0) ||
     (*(long *)(*(long *)(in_RDI + 0x28) + (*(long *)(in_RDI + 0x30) + -1) * 0x10 + 8) != local_18))
  {
    iVar1 = quicly_ranges_add(&state->acked,end_off,
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int quicly_sendstate_activate(quicly_sendstate_t *state)
{
    uint64_t end_off = state->final_size;

    /* take EOS position into account */
    if (end_off != UINT64_MAX)
        ++end_off;

    /* do nothing if already active */
    if (state->pending.num_ranges != 0 && state->pending.ranges[state->pending.num_ranges - 1].end == end_off)
        return 0;

    return quicly_ranges_add(&state->pending, state->size_inflight, end_off);
}